

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_api.c
# Opt level: O0

MPP_RET mpg4d_callback(void *dec,void *err_info)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  long lVar4;
  ulong uVar5;
  RK_U32 RVar6;
  RK_U32 RVar7;
  bool local_55;
  RK_U32 task_err;
  HalDecTask *task_dec;
  MppFrame mframe;
  DecCbHalDone *ctx;
  Mpg4dCtx *p_Dec;
  void *err_info_local;
  void *dec_local;
  
  mframe = err_info;
  ctx = (DecCbHalDone *)dec;
  p_Dec = (Mpg4dCtx *)err_info;
  err_info_local = dec;
  if ((dec == (void *)0x0) || (err_info == (void *)0x0)) {
    _mpp_log_l(2,"mpg4d_api","found NULL input dec %p err_info %p\n","mpg4d_callback",dec,err_info);
    dec_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    task_dec = (HalDecTask *)0x0;
    lVar4 = *err_info;
    mpp_buf_slot_get_prop(*dec,*(RK_S32 *)(lVar4 + 0x34),SLOT_FRAME_PTR,&task_dec);
    if (task_dec != (HalDecTask *)0x0) {
      local_55 = true;
      if ((*(ulong *)(lVar4 + 8) >> 2 & 1) == 0) {
        local_55 = (*(ulong *)(lVar4 + 8) >> 3 & 1) != 0;
      }
      if ((*(int *)((long)mframe + 0x10) != 0) || (local_55 != 0)) {
        mpp_frame_set_errinfo(task_dec,1);
        uVar1 = *(uint *)((long)&ctx[2].regs + 4);
        uVar2 = *(uint *)(lVar4 + 0x34);
        uVar3 = *(undefined4 *)((long)mframe + 0x10);
        uVar5 = *(ulong *)(lVar4 + 8);
        RVar6 = mpp_frame_get_errinfo(task_dec);
        RVar7 = mpp_frame_get_discard(task_dec);
        _mpp_log_l(4,"mpg4d_api",
                   "[CALLBACK] g_no=%d, out_idx=%d, dpberr=%d, harderr=%d, ref_flag=%d, errinfo=%d, discard=%d\n"
                   ,"mpg4d_callback",(ulong)uVar1,(ulong)uVar2,(uint)local_55,uVar3,
                   (uint)(uVar5 >> 4) & 1,RVar6,RVar7);
      }
    }
    dec_local._4_4_ = MPP_OK;
  }
  return dec_local._4_4_;
}

Assistant:

static MPP_RET mpg4d_callback(void *dec, void *err_info)
{
    Mpg4dCtx *p_Dec = (Mpg4dCtx *)dec;
    DecCbHalDone *ctx = (DecCbHalDone *)err_info;

    if (NULL == dec || NULL == err_info) {
        mpp_err_f("found NULL input dec %p err_info %p\n", dec, err_info);
        return MPP_ERR_NULL_PTR;
    }

    MppFrame mframe = NULL;
    HalDecTask *task_dec = (HalDecTask *)ctx->task;

    mpp_buf_slot_get_prop(p_Dec->frame_slots, task_dec->output, SLOT_FRAME_PTR, &mframe);
    if (mframe) {
        RK_U32 task_err = task_dec->flags.parse_err || task_dec->flags.ref_err;
        if (ctx->hard_err || task_err) {
            mpp_frame_set_errinfo(mframe, MPP_FRAME_ERR_UNKNOW);
            mpp_log_f("[CALLBACK] g_no=%d, out_idx=%d, dpberr=%d, harderr=%d, ref_flag=%d, errinfo=%d, discard=%d\n",
                      p_Dec->frame_count, task_dec->output, task_err, ctx->hard_err, task_dec->flags.used_for_ref,
                      mpp_frame_get_errinfo(mframe), mpp_frame_get_discard(mframe));
        }
    }
    return MPP_OK;
}